

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

uint __thiscall Assimp::XGLImporter::ReadIDAttr(XGLImporter *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  uint local_1c;
  int e;
  int i;
  XGLImporter *this_local;
  
  local_1c = 0;
  peVar4 = std::
           __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_reader);
  iVar1 = (*peVar4->_vptr_IIrrXMLReader[4])();
  while( true ) {
    if (iVar1 <= (int)local_1c) {
      return 0xffffffff;
    }
    peVar4 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar2 = (*peVar4->_vptr_IIrrXMLReader[5])(peVar4,(ulong)local_1c);
    iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar2),"id");
    if (iVar2 == 0) break;
    local_1c = local_1c + 1;
  }
  peVar4 = std::
           __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_reader);
  uVar3 = (*peVar4->_vptr_IIrrXMLReader[10])(peVar4,(ulong)local_1c);
  return uVar3;
}

Assistant:

unsigned int XGLImporter::ReadIDAttr()
{
    for(int i = 0, e = m_reader->getAttributeCount(); i < e; ++i) {

        if(!ASSIMP_stricmp(m_reader->getAttributeName(i),"id")) {
            return m_reader->getAttributeValueAsInt(i);
        }
    }
    return ~0u;
}